

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytestrie.cpp
# Opt level: O2

void icu_63::BytesTrie::getNextBranchBytes(uint8_t *pos,int32_t length,ByteSink *out)

{
  int32_t length_00;
  uint8_t *pos_00;
  int iVar1;
  ulong uVar2;
  uint8_t local_2a;
  uint8_t local_29;
  
  uVar2 = (ulong)(uint)length;
  while (iVar1 = (int)uVar2, 5 < iVar1) {
    pos_00 = jumpByDelta(pos + 1);
    length_00 = (int32_t)(uVar2 >> 1);
    getNextBranchBytes(pos_00,length_00,out);
    pos = skipDelta(pos + 1);
    uVar2 = (ulong)(uint)(iVar1 - length_00);
  }
  iVar1 = iVar1 + 1;
  do {
    local_2a = *pos;
    (*out->_vptr_ByteSink[2])(out,&local_2a,1);
    pos = skipValue(pos + 1);
    iVar1 = iVar1 + -1;
  } while (2 < iVar1);
  local_29 = *pos;
  (*out->_vptr_ByteSink[2])(out,&local_29,1);
  return;
}

Assistant:

void
BytesTrie::getNextBranchBytes(const uint8_t *pos, int32_t length, ByteSink &out) {
    while(length>kMaxBranchLinearSubNodeLength) {
        ++pos;  // ignore the comparison byte
        getNextBranchBytes(jumpByDelta(pos), length>>1, out);
        length=length-(length>>1);
        pos=skipDelta(pos);
    }
    do {
        append(out, *pos++);
        pos=skipValue(pos);
    } while(--length>1);
    append(out, *pos);
}